

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::DeadBranchElimPass::FindFirstExitFromSelectionMerge
          (DeadBranchElimPass *this,uint32_t start_block_id,uint32_t merge_block_id,
          uint32_t loop_merge_id,uint32_t loop_continue_id,uint32_t switch_merge_id)

{
  Op OVar1;
  Instruction *pIVar2;
  uint32_t uVar3;
  BasicBlock *this_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  if (((start_block_id != loop_continue_id) && (start_block_id != merge_block_id)) &&
     (start_block_id != loop_merge_id)) {
    do {
      this_00 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,start_block_id)
      ;
      pIVar2 = (this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar2 == (Instruction *)0x0) ||
         ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
        __assert_fail("!insts_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                      ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
      }
      pIVar2 = (this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      OVar1 = pIVar2->opcode_;
      if (OVar1 == OpBranch) {
        start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
        if (start_block_id == 0) {
          uVar3 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar3 = (uint)pIVar2->has_result_id_;
          }
          start_block_id = Instruction::GetSingleWordOperand(pIVar2,uVar3);
        }
      }
      else if (OVar1 == OpSwitch) {
        start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
        if (start_block_id == 0) {
          uVar6 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar6 = (uint)pIVar2->has_result_id_;
          }
          if ((int)((ulong)((long)(pIVar2->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pIVar2->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar6 < 2) {
            return (Instruction *)0x0;
          }
          bVar4 = false;
          uVar8 = 1;
          start_block_id = 0;
          do {
            uVar3 = Instruction::GetSingleWordOperand(pIVar2,uVar6 + uVar8);
            if (uVar3 == merge_block_id) {
              bVar4 = true;
            }
            else if (uVar3 != loop_continue_id && uVar3 != loop_merge_id) {
              uVar6 = (pIVar2->has_result_id_ & 1) + 1;
              if (pIVar2->has_type_id_ == false) {
                uVar6 = (uint)pIVar2->has_result_id_;
              }
              start_block_id = Instruction::GetSingleWordOperand(pIVar2,uVar6 + uVar8);
            }
            uVar8 = uVar8 + 2;
            uVar6 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar6 = (uint)pIVar2->has_result_id_;
            }
          } while (uVar8 < (int)((ulong)((long)(pIVar2->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pIVar2->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555 - uVar6);
          if (start_block_id == 0 || bVar4) {
            if (start_block_id == 0) {
              return (Instruction *)0x0;
            }
            return pIVar2;
          }
        }
      }
      else {
        if (OVar1 != OpBranchConditional) {
          return (Instruction *)0x0;
        }
        start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
        if (start_block_id == 0) {
          iVar5 = 1;
          iVar7 = 2;
          while( true ) {
            uVar6 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar6 = (uint)pIVar2->has_result_id_;
            }
            uVar3 = Instruction::GetSingleWordOperand(pIVar2,uVar6 + iVar5);
            if ((loop_merge_id != merge_block_id) && (uVar3 == loop_merge_id)) break;
            uVar6 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar6 = (uint)pIVar2->has_result_id_;
            }
            uVar3 = Instruction::GetSingleWordOperand(pIVar2,uVar6 + iVar5);
            if ((loop_continue_id != merge_block_id) && (uVar3 == loop_continue_id)) break;
            uVar6 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar6 = (uint)pIVar2->has_result_id_;
            }
            uVar3 = Instruction::GetSingleWordOperand(pIVar2,uVar6 + iVar5);
            if ((switch_merge_id != merge_block_id) && (uVar3 == switch_merge_id)) break;
            iVar5 = iVar5 + 1;
            iVar7 = iVar7 + -1;
            if (iVar7 == 0) {
              return pIVar2;
            }
          }
          uVar6 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar6 = (uint)pIVar2->has_result_id_;
          }
          start_block_id = Instruction::GetSingleWordOperand(pIVar2,uVar6 + iVar7);
          if (start_block_id == 0) {
            return pIVar2;
          }
        }
      }
      if ((start_block_id == loop_continue_id) || (start_block_id == merge_block_id)) {
        return (Instruction *)0x0;
      }
    } while (start_block_id != loop_merge_id);
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* DeadBranchElimPass::FindFirstExitFromSelectionMerge(
    uint32_t start_block_id, uint32_t merge_block_id, uint32_t loop_merge_id,
    uint32_t loop_continue_id, uint32_t switch_merge_id) {
  // To find the "first" exit, we follow branches looking for a conditional
  // branch that is not in a nested construct and is not the header of a new
  // construct.  We follow the control flow from |start_block_id| to find the
  // first one.

  while (start_block_id != merge_block_id && start_block_id != loop_merge_id &&
         start_block_id != loop_continue_id) {
    BasicBlock* start_block = context()->get_instr_block(start_block_id);
    Instruction* branch = start_block->terminator();
    uint32_t next_block_id = 0;
    switch (branch->opcode()) {
      case spv::Op::OpBranchConditional:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // If a possible target is the |loop_merge_id| or |loop_continue_id|,
          // which are not the current merge node, then we continue the search
          // with the other target.
          for (uint32_t i = 1; i < 3; i++) {
            if (branch->GetSingleWordInOperand(i) == loop_merge_id &&
                loop_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == loop_continue_id &&
                loop_continue_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == switch_merge_id &&
                switch_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
          }

          if (next_block_id == 0) {
            return branch;
          }
        }
        break;
      case spv::Op::OpSwitch:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // A switch with no merge instructions can have at most 5 targets:
          //   a. |merge_block_id|
          //   b. |loop_merge_id|
          //   c. |loop_continue_id|
          //   d. |switch_merge_id|
          //   e. 1 block inside the current region.
          //
          // Note that because this is a switch, |merge_block_id| must equal
          // |switch_merge_id|.
          //
          // This leads to a number of cases of what to do.
          //
          // 1. Does not jump to a block inside of the current construct.  In
          // this case, there is not conditional break, so we should return
          // |nullptr|.
          //
          // 2. Jumps to |merge_block_id| and a block inside the current
          // construct.  In this case, this branch conditionally break to the
          // end of the current construct, so return the current branch.
          //
          // 3.  Otherwise, this branch may break, but not to the current merge
          // block.  So we continue with the block that is inside the loop.
          bool found_break = false;
          for (uint32_t i = 1; i < branch->NumInOperands(); i += 2) {
            uint32_t target = branch->GetSingleWordInOperand(i);
            if (target == merge_block_id) {
              found_break = true;
            } else if (target != loop_merge_id && target != loop_continue_id) {
              next_block_id = branch->GetSingleWordInOperand(i);
            }
          }

          if (next_block_id == 0) {
            // Case 1.
            return nullptr;
          }

          if (found_break) {
            // Case 2.
            return branch;
          }

          // The fall through is case 3.
        }
        break;
      case spv::Op::OpBranch:
        // Need to check if this is the header of a loop nested in the
        // selection construct.
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          next_block_id = branch->GetSingleWordInOperand(0);
        }
        break;
      default:
        return nullptr;
    }
    start_block_id = next_block_id;
  }
  return nullptr;
}